

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPExternalTransmitter::GetLocalHostName
          (RTPExternalTransmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  int iVar1;
  size_t sVar2;
  uint8_t *__dest;
  ulong __n;
  char name [1024];
  
  iVar1 = -0x97;
  if (this->init == true) {
    iVar1 = -0x96;
    if (this->created == true) {
      if (this->localhostname == (uint8_t *)0x0) {
        iVar1 = gethostname(name,0x3ff);
        if (iVar1 == 0) {
          name[0x3ff] = '\0';
        }
        else {
          builtin_strncpy(name,"localhost",10);
        }
        sVar2 = strlen(name);
        this->localhostnamelength = sVar2;
        __dest = (uint8_t *)
                 operator_new__(sVar2 + 1,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr,0);
        this->localhostname = __dest;
        memcpy(__dest,name,this->localhostnamelength);
        this->localhostname[this->localhostnamelength] = '\0';
      }
      __n = this->localhostnamelength;
      if (*bufferlength < __n) {
        iVar1 = -0x45;
      }
      else {
        memcpy(buffer,this->localhostname,__n);
        __n = this->localhostnamelength;
        iVar1 = 0;
      }
      *bufferlength = __n;
    }
  }
  return iVar1;
}

Assistant:

int RTPExternalTransmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_EXTERNALTRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_EXTERNALTRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		// We'll just use 'gethostname' for simplicity

		char name[1024];

		if (gethostname(name,1023) != 0)
			strcpy(name, "localhost"); // failsafe
		else
			name[1023] = 0; // ensure null-termination

		localhostnamelength = strlen(name);
		localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];

		memcpy(localhostname, name, localhostnamelength);
		localhostname[localhostnamelength] = 0;
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}